

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int csv_write_callback(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  sxu32 sVar1;
  sxi32 sVar2;
  char *zStr;
  long lVar3;
  char cVar4;
  int nLen;
  sxu32 n;
  sxu32 local_30;
  sxu32 local_2c;
  
  zStr = jx9_value_to_string(pValue,(int *)&local_30);
  if (0 < (int)local_30) {
    if (0 < *(int *)((long)pUserData + 0x10)) {
      (**(code **)(**(long **)((long)pUserData + 8) + 0x40))
                ((*(long **)((long)pUserData + 8))[1],pUserData,1);
    }
    local_2c = 1;
    cVar4 = '\0';
    sVar2 = SyByteFind(zStr,local_30,*pUserData,(sxu32 *)0x0);
    if ((sVar2 == 0) ||
       (sVar2 = SyByteFind(zStr,local_30,*(sxi32 *)((long)pUserData + 4),&local_2c), sVar2 == 0)) {
      sVar1 = local_2c;
      cVar4 = (local_2c == 0) + '\x01';
      (**(code **)(**(long **)((long)pUserData + 8) + 0x40))
                ((*(long **)((long)pUserData + 8))[1],(long)pUserData + 4,1);
      if (sVar1 == 0) {
        (**(code **)(**(long **)((long)pUserData + 8) + 0x40))
                  ((*(long **)((long)pUserData + 8))[1],(long)pUserData + 4,1);
      }
    }
    lVar3 = (**(code **)(**(long **)((long)pUserData + 8) + 0x40))
                      ((*(long **)((long)pUserData + 8))[1],zStr,(long)(int)local_30);
    if (lVar3 < 1) {
      return -10;
    }
    if (cVar4 != '\0') {
      (**(code **)(**(long **)((long)pUserData + 8) + 0x40))
                ((*(long **)((long)pUserData + 8))[1],(long)pUserData + 4,1);
      if (cVar4 != '\x01') {
        (**(code **)(**(long **)((long)pUserData + 8) + 0x40))
                  ((*(long **)((long)pUserData + 8))[1],(long)pUserData + 4,1);
      }
    }
    *(int *)((long)pUserData + 0x10) = *(int *)((long)pUserData + 0x10) + 1;
  }
  return 0;
}

Assistant:

static int csv_write_callback(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	struct csv_data *pData = (struct csv_data *)pUserData;
	const char *zData;
	int nLen, c2;
	sxu32 n;
	/* Point to the raw data */
	zData = jx9_value_to_string(pValue, &nLen);
	if( nLen < 1 ){
		/* Nothing to write */
		return JX9_OK;
	}
	if( pData->iCount > 0 ){
		/* Write the delimiter */
		pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->delimiter, sizeof(char));
	}
	n = 1;
	c2 = 0;
	if( SyByteFind(zData, (sxu32)nLen, pData->delimiter, 0) == SXRET_OK || 
		SyByteFind(zData, (sxu32)nLen, pData->enclosure, &n) == SXRET_OK ){
			c2 = 1;
			if( n == 0 ){
				c2 = 2;
			}
			/* Write the enclosure */
			pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->enclosure, sizeof(char));
			if( c2 > 1 ){
				pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->enclosure, sizeof(char));
			}
	}
	/* Write the data */
	if( pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)zData, (jx9_int64)nLen) < 1 ){
		SXUNUSED(pKey); /* cc warning */
		return JX9_ABORT;
	}
	if( c2 > 0 ){
		/* Write the enclosure */
		pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->enclosure, sizeof(char));
		if( c2 > 1 ){
			pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->enclosure, sizeof(char));
		}
	}
	pData->iCount++;
	return JX9_OK;
}